

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  cmLocalGenerator *this_00;
  pointer pbVar1;
  byte bVar2;
  PositionType this_01;
  bool bVar3;
  cmGlobalGenerator *this_02;
  cmMakefile *this_03;
  char *pcVar4;
  undefined8 uVar5;
  reference ppcVar6;
  undefined8 uVar7;
  cmTarget *this_04;
  reference lib;
  string *name;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  cmLocalGenerator *local_500;
  cmLocalGenerator *lg_1;
  cmGeneratorTarget *gtgt;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  string local_448;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_428;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  const_iterator libIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string local_3f0;
  undefined1 local_3d0 [8];
  string libs;
  string local_3a8;
  cmTarget *local_388;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  char *targetName;
  string local_358;
  string local_338 [8];
  string definitions;
  string local_310;
  undefined1 local_2f0 [8];
  string includeFlags;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  string local_2a8;
  undefined1 local_288 [8];
  string includes;
  string local_260;
  byte local_23a;
  allocator local_239;
  undefined1 local_238 [6];
  bool quiet;
  byte local_213;
  allocator local_212;
  allocator local_211;
  undefined1 local_210 [5];
  bool packageFound;
  string local_1f0 [8];
  string packageName;
  string local_1c8;
  undefined1 local_1a8 [8];
  string mode;
  string local_180;
  undefined1 local_160 [8];
  string language;
  string systemFile;
  cmMakefile *mf;
  Directory local_f8;
  string local_d0;
  Directory local_b0;
  undefined1 local_88 [8];
  Snapshot snapshot;
  cmGlobalGenerator *gg;
  string local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_38,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&gg,(SystemTools *)0x1,collapse);
  SetHomeOutputDirectory(this,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  this_02 = (cmGlobalGenerator *)operator_new(0x530);
  cmGlobalGenerator::cmGlobalGenerator(this_02,this);
  snapshot.Position.Position = (PositionType)this_02;
  SetGlobalGenerator(this,this_02);
  GetCurrentSnapshot((Snapshot *)local_88,this);
  cmState::Snapshot::GetDirectory(&local_b0,(Snapshot *)local_88);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_d0,(SystemTools *)0x1,collapse_00);
  cmState::Directory::SetCurrentBinary(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  cmState::Snapshot::GetDirectory(&local_f8,(Snapshot *)local_88);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&mf,(SystemTools *)0x1,collapse_01);
  cmState::Directory::SetCurrentSource(&local_f8,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_88);
  this_03 = (cmMakefile *)operator_new(0x730);
  cmMakefile::cmMakefile
            (this_03,(cmGlobalGenerator *)snapshot.Position.Position,(Snapshot *)local_88);
  cmGlobalGenerator::AddMakefile((cmGlobalGenerator *)snapshot.Position.Position,this_03);
  cmMakefile::SetArgcArgv(this_03,local_18);
  cmMakefile::GetModulesFile_abi_cxx11_
            ((string *)((long)&language.field_2 + 8),this_03,"CMakeFindPackageMode.cmake");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmMakefile::ReadListFile(this_03,pcVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"LANGUAGE",(allocator *)(mode.field_2._M_local_buf + 0xf));
  pcVar4 = cmMakefile::GetSafeDefinition(this_03,&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_160,pcVar4,(allocator *)(mode.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c8,"MODE",(allocator *)(packageName.field_2._M_local_buf + 0xf));
  pcVar4 = cmMakefile::GetSafeDefinition(this_03,&local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1a8,pcVar4,(allocator *)(packageName.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_210,"NAME",&local_211);
  pcVar4 = cmMakefile::GetSafeDefinition(this_03,(string *)local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,pcVar4,&local_212);
  std::allocator<char>::~allocator((allocator<char> *)&local_212);
  std::__cxx11::string::~string((string *)local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_238,"PACKAGE_FOUND",&local_239);
  bVar3 = cmMakefile::IsOn(this_03,(string *)local_238);
  std::__cxx11::string::~string((string *)local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  local_213 = bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_260,"PACKAGE_QUIET",(allocator *)(includes.field_2._M_local_buf + 0xf)
            );
  bVar3 = cmMakefile::IsOn(this_03,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
  local_23a = bVar3;
  if ((local_213 & 1) == 0) {
    if (!bVar3) {
      uVar5 = std::__cxx11::string::c_str();
      printf("%s not found.\n",uVar5);
    }
  }
  else {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1a8,"EXIST");
    if (bVar3) {
      if ((local_23a & 1) == 0) {
        uVar5 = std::__cxx11::string::c_str();
        printf("%s found.\n",uVar5);
      }
    }
    else {
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_1a8,"COMPILE");
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2a8,"PACKAGE_INCLUDE_DIRS",
                   (allocator *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pcVar4 = cmMakefile::GetSafeDefinition(this_03,&local_2a8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_288,pcVar4,
                   (allocator *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&lg);
        cmSystemTools::ExpandListArgument
                  ((string *)local_288,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lg,false);
        cmGlobalGenerator::CreateGenerationObjects
                  ((cmGlobalGenerator *)snapshot.Position.Position,AllTargets);
        ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                            ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                             (snapshot.Position.Position + 0x90),0);
        this_00 = *ppcVar6;
        includeFlags.field_2._8_8_ = this_00;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_310,"",(allocator *)(definitions.field_2._M_local_buf + 0xf));
        cmLocalGenerator::GetIncludeFlags
                  ((string *)local_2f0,this_00,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&lg,(cmGeneratorTarget *)0x0,(string *)local_160,false,false,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(definitions.field_2._M_local_buf + 0xf));
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_358,"PACKAGE_DEFINITIONS",(allocator *)((long)&targetName + 7));
        pcVar4 = cmMakefile::GetSafeDefinition(this_03,&local_358);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_338,pcVar4,(allocator *)((long)&targetName + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetName + 6));
        std::__cxx11::string::~string((string *)&local_358);
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetName + 7));
        uVar5 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        printf("%s %s\n",uVar5,uVar7);
        std::__cxx11::string::~string(local_338);
        std::__cxx11::string::~string((string *)local_2f0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&lg);
        std::__cxx11::string::~string((string *)local_288);
      }
      else {
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_1a8,"LINK");
        if (bVar3) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_9e107;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tgt);
          this_04 = cmMakefile::AddExecutable
                              (this_03,(char *)srcs.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tgt,true);
          local_388 = this_04;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3a8,"LINKER_LANGUAGE",
                     (allocator *)(libs.field_2._M_local_buf + 0xf));
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(this_04,&local_3a8,pcVar4);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3f0,"PACKAGE_LIBRARIES",
                     (allocator *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          pcVar4 = cmMakefile::GetSafeDefinition(this_03,&local_3f0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_3d0,pcVar4,
                     (allocator *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
          std::__cxx11::string::~string((string *)&local_3f0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&libIt);
          cmSystemTools::ExpandListArgument
                    ((string *)local_3d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&libIt,false);
          local_420._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&libIt);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_418,&local_420);
          while( true ) {
            local_428._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&libIt);
            bVar3 = __gnu_cxx::operator!=(&local_418,&local_428);
            pbVar1 = srcs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (!bVar3) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_448,(char *)pbVar1,
                       (allocator *)(linkLibs.field_2._M_local_buf + 0xf));
            lib = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_418);
            cmMakefile::AddLinkLibraryForTarget(this_03,&local_448,lib,GENERAL_LibraryType);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(linkLibs.field_2._M_local_buf + 0xf));
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_418);
          }
          std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&gtgt);
          cmGlobalGenerator::CreateGenerationObjects
                    ((cmGlobalGenerator *)snapshot.Position.Position,AllTargets);
          this_01 = snapshot.Position.Position;
          name = cmTarget::GetName_abi_cxx11_(local_388);
          lg_1 = (cmLocalGenerator *)
                 cmGlobalGenerator::FindGeneratorTarget((cmGlobalGenerator *)this_01,name);
          local_500 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)lg_1);
          cmLocalGenerator::GetTargetFlags
                    (local_500,(string *)((long)&frameworkPath.field_2 + 8),
                     (string *)((long)&linkPath.field_2 + 8),(string *)((long)&flags.field_2 + 8),
                     (string *)((long)&linkFlags.field_2 + 8),(string *)&gtgt,
                     (cmGeneratorTarget *)lg_1,false);
          std::operator+(&local_540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkPath.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flags.field_2 + 8));
          std::operator+(&local_520,&local_540,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&frameworkPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_520);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_540);
          uVar5 = std::__cxx11::string::c_str();
          printf("%s\n",uVar5);
          std::__cxx11::string::~string((string *)&gtgt);
          std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&libIt);
          std::__cxx11::string::~string((string *)local_3d0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tgt);
        }
      }
    }
  }
  bVar2 = local_213;
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)(language.field_2._M_local_buf + 8));
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  cmState::Snapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary
    (cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource
    (cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  cmMakefile* mf = new cmMakefile(gg, snapshot);
  gg->AddMakefile(mf);

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile.c_str());

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound)
    {
    if (!quiet)
      {
      printf("%s not found.\n", packageName.c_str());
      }
    }
  else if (mode == "EXIST")
    {
    if (!quiet)
      {
      printf("%s found.\n", packageName.c_str());
      }
    }
  else if (mode == "COMPILE")
    {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    gg->CreateGenerationObjects();
    cmLocalGenerator* lg = gg->LocalGenerators[0];
    std::string includeFlags = lg->GetIncludeFlags(includeDirs, 0, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
    }
  else if (mode == "LINK")
    {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for(std::vector<std::string>::const_iterator libIt=libList.begin();
            libIt != libList.end();
            ++libIt)
      {
      mf->AddLinkLibraryForTarget(targetName, *libIt,
                                  GENERAL_LibraryType);
      }


    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGenerationObjects();
    cmGeneratorTarget *gtgt = gg->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    lg->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       gtgt, false);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str() );

/*    if ( use_win32 )
      {
      tgt->SetProperty("WIN32_EXECUTABLE", "ON");
      }
    if ( use_macbundle)
      {
      tgt->SetProperty("MACOSX_BUNDLE", "ON");
      }*/
    }

  // free generic one if generated
//  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
//  delete gg; // this crashes inside the cmake instance

  return packageFound;
}